

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ed25519-donna-impl-base.h
# Opt level: O3

void ge25519_double(ge25519 *r,ge25519 *p)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  ulong uVar217;
  ulong uVar218;
  ulong uVar219;
  ulong uVar220;
  ulong uVar221;
  ulong uVar222;
  ulong uVar223;
  ulong uVar224;
  ulong uVar225;
  ulong uVar226;
  ulong uVar227;
  ulong uVar228;
  ulong uVar229;
  ge25519_p1p1 t;
  ge25519_p1p1 local_d0;
  
  ge25519_double_p1p1(&local_d0,p);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = local_d0.x[0];
  auVar101._8_8_ = 0;
  auVar101._0_8_ = local_d0.t[0];
  auVar2._8_8_ = 0;
  auVar2._0_8_ = local_d0.x[1];
  auVar102._8_8_ = 0;
  auVar102._0_8_ = local_d0.t[0];
  auVar3._8_8_ = 0;
  auVar3._0_8_ = local_d0.x[0];
  auVar103._8_8_ = 0;
  auVar103._0_8_ = local_d0.t[1];
  auVar4._8_8_ = 0;
  auVar4._0_8_ = local_d0.x[2];
  auVar104._8_8_ = 0;
  auVar104._0_8_ = local_d0.t[0];
  auVar5._8_8_ = 0;
  auVar5._0_8_ = local_d0.x[0];
  auVar105._8_8_ = 0;
  auVar105._0_8_ = local_d0.t[2];
  auVar6._8_8_ = 0;
  auVar6._0_8_ = local_d0.x[1];
  auVar106._8_8_ = 0;
  auVar106._0_8_ = local_d0.t[1];
  auVar7._8_8_ = 0;
  auVar7._0_8_ = local_d0.x[3];
  auVar107._8_8_ = 0;
  auVar107._0_8_ = local_d0.t[0];
  auVar8._8_8_ = 0;
  auVar8._0_8_ = local_d0.x[0];
  auVar108._8_8_ = 0;
  auVar108._0_8_ = local_d0.t[3];
  auVar9._8_8_ = 0;
  auVar9._0_8_ = local_d0.x[2];
  auVar109._8_8_ = 0;
  auVar109._0_8_ = local_d0.t[1];
  auVar10._8_8_ = 0;
  auVar10._0_8_ = local_d0.x[1];
  auVar110._8_8_ = 0;
  auVar110._0_8_ = local_d0.t[2];
  auVar11._8_8_ = 0;
  auVar11._0_8_ = local_d0.x[4];
  auVar111._8_8_ = 0;
  auVar111._0_8_ = local_d0.t[0];
  auVar12._8_8_ = 0;
  auVar12._0_8_ = local_d0.x[0];
  auVar112._8_8_ = 0;
  auVar112._0_8_ = local_d0.t[4];
  auVar13._8_8_ = 0;
  auVar13._0_8_ = local_d0.x[1];
  auVar113._8_8_ = 0;
  auVar113._0_8_ = local_d0.t[3];
  auVar14._8_8_ = 0;
  auVar14._0_8_ = local_d0.x[3];
  auVar114._8_8_ = 0;
  auVar114._0_8_ = local_d0.t[1];
  auVar15._8_8_ = 0;
  auVar15._0_8_ = local_d0.x[2];
  auVar115._8_8_ = 0;
  auVar115._0_8_ = local_d0.t[2];
  uVar217 = local_d0.t[2] * 0x13;
  uVar218 = local_d0.t[4] * 0x13;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = local_d0.x[1];
  auVar116._8_8_ = 0;
  auVar116._0_8_ = uVar218;
  uVar219 = local_d0.t[3] * 0x13;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = local_d0.x[4];
  auVar117._8_8_ = 0;
  auVar117._0_8_ = local_d0.t[1] * 0x13;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = local_d0.x[3];
  auVar118._8_8_ = 0;
  auVar118._0_8_ = uVar217;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = local_d0.x[2];
  auVar119._8_8_ = 0;
  auVar119._0_8_ = uVar219;
  auVar1 = auVar19 * auVar119 + auVar16 * auVar116 + auVar1 * auVar101 + auVar18 * auVar118 +
           auVar17 * auVar117;
  uVar229 = auVar1._0_8_;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = local_d0.x[2];
  auVar120._8_8_ = 0;
  auVar120._0_8_ = uVar218;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = local_d0.x[4];
  auVar121._8_8_ = 0;
  auVar121._0_8_ = uVar217;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = local_d0.x[3];
  auVar122._8_8_ = 0;
  auVar122._0_8_ = uVar219;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = local_d0.x[3];
  auVar123._8_8_ = 0;
  auVar123._0_8_ = uVar218;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = local_d0.x[4];
  auVar124._8_8_ = 0;
  auVar124._0_8_ = uVar219;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = local_d0.x[4];
  auVar125._8_8_ = 0;
  auVar125._0_8_ = uVar218;
  auVar205._8_8_ = 0;
  auVar205._0_8_ = auVar1._8_8_ * 0x2000 | uVar229 >> 0x33;
  auVar205 = auVar22 * auVar122 + auVar20 * auVar120 + auVar2 * auVar102 + auVar3 * auVar103 +
             auVar21 * auVar121 + auVar205;
  uVar222 = auVar205._0_8_;
  auVar206._8_8_ = 0;
  auVar206._0_8_ = auVar205._8_8_ * 0x2000 | uVar222 >> 0x33;
  auVar206 = auVar4 * auVar104 + auVar5 * auVar105 + auVar6 * auVar106 + auVar23 * auVar123 +
             auVar24 * auVar124 + auVar206;
  uVar220 = auVar206._0_8_;
  auVar201._8_8_ = 0;
  auVar201._0_8_ = auVar206._8_8_ * 0x2000 | uVar220 >> 0x33;
  auVar201 = auVar25 * auVar125 +
             auVar9 * auVar109 + auVar8 * auVar108 + auVar10 * auVar110 + auVar7 * auVar107 +
             auVar201;
  uVar223 = auVar201._0_8_;
  auVar207._8_8_ = 0;
  auVar207._0_8_ = auVar201._8_8_ << 0xd | uVar223 >> 0x33;
  auVar207 = auVar11 * auVar111 +
             auVar14 * auVar114 + auVar15 * auVar115 + auVar12 * auVar112 + auVar13 * auVar113 +
             auVar207;
  uVar224 = auVar207._0_8_;
  uVar229 = (auVar207._8_8_ * 0x2000 | uVar224 >> 0x33) * 0x13 + (uVar229 & 0x7ffffffffffff);
  r->x[0] = uVar229 & 0x7ffffffffffff;
  r->x[1] = (uVar229 >> 0x33) + (uVar222 & 0x7ffffffffffff);
  r->x[2] = uVar220 & 0x7ffffffffffff;
  r->x[3] = uVar223 & 0x7ffffffffffff;
  r->x[4] = uVar224 & 0x7ffffffffffff;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = local_d0.y[0];
  auVar126._8_8_ = 0;
  auVar126._0_8_ = local_d0.z[0];
  auVar27._8_8_ = 0;
  auVar27._0_8_ = local_d0.y[1];
  auVar127._8_8_ = 0;
  auVar127._0_8_ = local_d0.z[0];
  auVar28._8_8_ = 0;
  auVar28._0_8_ = local_d0.y[0];
  auVar128._8_8_ = 0;
  auVar128._0_8_ = local_d0.z[1];
  auVar29._8_8_ = 0;
  auVar29._0_8_ = local_d0.y[2];
  auVar129._8_8_ = 0;
  auVar129._0_8_ = local_d0.z[0];
  auVar30._8_8_ = 0;
  auVar30._0_8_ = local_d0.y[0];
  auVar130._8_8_ = 0;
  auVar130._0_8_ = local_d0.z[2];
  auVar31._8_8_ = 0;
  auVar31._0_8_ = local_d0.y[1];
  auVar131._8_8_ = 0;
  auVar131._0_8_ = local_d0.z[1];
  auVar32._8_8_ = 0;
  auVar32._0_8_ = local_d0.y[3];
  auVar132._8_8_ = 0;
  auVar132._0_8_ = local_d0.z[0];
  auVar33._8_8_ = 0;
  auVar33._0_8_ = local_d0.y[0];
  auVar133._8_8_ = 0;
  auVar133._0_8_ = local_d0.z[3];
  auVar34._8_8_ = 0;
  auVar34._0_8_ = local_d0.y[2];
  auVar134._8_8_ = 0;
  auVar134._0_8_ = local_d0.z[1];
  auVar35._8_8_ = 0;
  auVar35._0_8_ = local_d0.y[1];
  auVar135._8_8_ = 0;
  auVar135._0_8_ = local_d0.z[2];
  auVar36._8_8_ = 0;
  auVar36._0_8_ = local_d0.y[4];
  auVar136._8_8_ = 0;
  auVar136._0_8_ = local_d0.z[0];
  auVar37._8_8_ = 0;
  auVar37._0_8_ = local_d0.y[0];
  auVar137._8_8_ = 0;
  auVar137._0_8_ = local_d0.z[4];
  auVar38._8_8_ = 0;
  auVar38._0_8_ = local_d0.y[1];
  auVar138._8_8_ = 0;
  auVar138._0_8_ = local_d0.z[3];
  auVar39._8_8_ = 0;
  auVar39._0_8_ = local_d0.y[3];
  auVar139._8_8_ = 0;
  auVar139._0_8_ = local_d0.z[1];
  auVar40._8_8_ = 0;
  auVar40._0_8_ = local_d0.y[2];
  auVar140._8_8_ = 0;
  auVar140._0_8_ = local_d0.z[2];
  uVar229 = local_d0.z[4] * 0x13;
  auVar41._8_8_ = 0;
  auVar41._0_8_ = local_d0.y[1];
  auVar141._8_8_ = 0;
  auVar141._0_8_ = uVar229;
  uVar220 = local_d0.z[3] * 0x13;
  auVar42._8_8_ = 0;
  auVar42._0_8_ = local_d0.y[4];
  auVar142._8_8_ = 0;
  auVar142._0_8_ = local_d0.z[1] * 0x13;
  auVar43._8_8_ = 0;
  auVar43._0_8_ = local_d0.y[3];
  auVar143._8_8_ = 0;
  auVar143._0_8_ = local_d0.z[2] * 0x13;
  auVar44._8_8_ = 0;
  auVar44._0_8_ = local_d0.y[2];
  auVar144._8_8_ = 0;
  auVar144._0_8_ = uVar220;
  auVar1 = auVar44 * auVar144 + auVar41 * auVar141 + auVar26 * auVar126 + auVar43 * auVar143 +
           auVar42 * auVar142;
  uVar224 = auVar1._0_8_;
  auVar45._8_8_ = 0;
  auVar45._0_8_ = local_d0.y[2];
  auVar145._8_8_ = 0;
  auVar145._0_8_ = uVar229;
  auVar46._8_8_ = 0;
  auVar46._0_8_ = local_d0.y[4];
  auVar146._8_8_ = 0;
  auVar146._0_8_ = local_d0.z[2] * 0x13;
  auVar47._8_8_ = 0;
  auVar47._0_8_ = local_d0.y[3];
  auVar147._8_8_ = 0;
  auVar147._0_8_ = uVar220;
  auVar48._8_8_ = 0;
  auVar48._0_8_ = local_d0.y[3];
  auVar148._8_8_ = 0;
  auVar148._0_8_ = uVar229;
  auVar49._8_8_ = 0;
  auVar49._0_8_ = local_d0.y[4];
  auVar149._8_8_ = 0;
  auVar149._0_8_ = uVar220;
  auVar50._8_8_ = 0;
  auVar50._0_8_ = local_d0.y[4];
  auVar150._8_8_ = 0;
  auVar150._0_8_ = uVar229;
  auVar208._8_8_ = 0;
  auVar208._0_8_ = auVar1._8_8_ * 0x2000 | uVar224 >> 0x33;
  auVar208 = auVar47 * auVar147 + auVar45 * auVar145 + auVar27 * auVar127 + auVar28 * auVar128 +
             auVar46 * auVar146 + auVar208;
  uVar227 = auVar208._0_8_;
  auVar202._8_8_ = 0;
  auVar202._0_8_ = auVar208._8_8_ * 0x2000 | uVar227 >> 0x33;
  auVar202 = auVar49 * auVar149 +
             auVar29 * auVar129 + auVar30 * auVar130 + auVar31 * auVar131 + auVar48 * auVar148 +
             auVar202;
  uVar222 = auVar202._0_8_;
  auVar203._8_8_ = 0;
  auVar203._0_8_ = auVar202._8_8_ << 0xd | uVar222 >> 0x33;
  auVar203 = auVar50 * auVar150 +
             auVar32 * auVar132 + auVar34 * auVar134 + auVar33 * auVar133 + auVar35 * auVar135 +
             auVar203;
  uVar223 = auVar203._0_8_;
  auVar209._8_8_ = 0;
  auVar209._0_8_ = auVar203._8_8_ << 0xd | uVar223 >> 0x33;
  auVar209 = auVar36 * auVar136 +
             auVar39 * auVar139 + auVar40 * auVar140 + auVar37 * auVar137 + auVar38 * auVar138 +
             auVar209;
  uVar229 = auVar209._0_8_;
  auVar51._8_8_ = 0;
  auVar51._0_8_ = local_d0.z[0];
  auVar151._8_8_ = 0;
  auVar151._0_8_ = local_d0.t[0];
  auVar52._8_8_ = 0;
  auVar52._0_8_ = local_d0.z[1];
  auVar152._8_8_ = 0;
  auVar152._0_8_ = local_d0.t[0];
  auVar53._8_8_ = 0;
  auVar53._0_8_ = local_d0.z[0];
  auVar153._8_8_ = 0;
  auVar153._0_8_ = local_d0.t[1];
  auVar54._8_8_ = 0;
  auVar54._0_8_ = local_d0.z[2];
  auVar154._8_8_ = 0;
  auVar154._0_8_ = local_d0.t[0];
  auVar55._8_8_ = 0;
  auVar55._0_8_ = local_d0.z[0];
  auVar155._8_8_ = 0;
  auVar155._0_8_ = local_d0.t[2];
  uVar225 = (auVar209._8_8_ * 0x2000 | uVar229 >> 0x33) * 0x13 + (uVar224 & 0x7ffffffffffff);
  auVar56._8_8_ = 0;
  auVar56._0_8_ = local_d0.z[1];
  auVar156._8_8_ = 0;
  auVar156._0_8_ = local_d0.t[1];
  auVar57._8_8_ = 0;
  auVar57._0_8_ = local_d0.z[3];
  auVar157._8_8_ = 0;
  auVar157._0_8_ = local_d0.t[0];
  auVar58._8_8_ = 0;
  auVar58._0_8_ = local_d0.z[0];
  auVar158._8_8_ = 0;
  auVar158._0_8_ = local_d0.t[3];
  auVar59._8_8_ = 0;
  auVar59._0_8_ = local_d0.z[2];
  auVar159._8_8_ = 0;
  auVar159._0_8_ = local_d0.t[1];
  auVar60._8_8_ = 0;
  auVar60._0_8_ = local_d0.z[1];
  auVar160._8_8_ = 0;
  auVar160._0_8_ = local_d0.t[2];
  auVar61._8_8_ = 0;
  auVar61._0_8_ = local_d0.z[4];
  auVar161._8_8_ = 0;
  auVar161._0_8_ = local_d0.t[0];
  auVar62._8_8_ = 0;
  auVar62._0_8_ = local_d0.z[0];
  auVar162._8_8_ = 0;
  auVar162._0_8_ = local_d0.t[4];
  auVar63._8_8_ = 0;
  auVar63._0_8_ = local_d0.z[1];
  auVar163._8_8_ = 0;
  auVar163._0_8_ = local_d0.t[3];
  auVar64._8_8_ = 0;
  auVar64._0_8_ = local_d0.z[3];
  auVar164._8_8_ = 0;
  auVar164._0_8_ = local_d0.t[1];
  auVar65._8_8_ = 0;
  auVar65._0_8_ = local_d0.z[2];
  auVar165._8_8_ = 0;
  auVar165._0_8_ = local_d0.t[2];
  auVar66._8_8_ = 0;
  auVar66._0_8_ = local_d0.z[1];
  auVar166._8_8_ = 0;
  auVar166._0_8_ = uVar218;
  auVar67._8_8_ = 0;
  auVar67._0_8_ = local_d0.z[4];
  auVar167._8_8_ = 0;
  auVar167._0_8_ = local_d0.t[1] * 0x13;
  auVar68._8_8_ = 0;
  auVar68._0_8_ = local_d0.z[3];
  auVar168._8_8_ = 0;
  auVar168._0_8_ = uVar217;
  auVar69._8_8_ = 0;
  auVar69._0_8_ = local_d0.z[2];
  auVar169._8_8_ = 0;
  auVar169._0_8_ = uVar219;
  auVar1 = auVar67 * auVar167 +
           auVar69 * auVar169 + auVar66 * auVar166 + auVar51 * auVar151 + auVar68 * auVar168;
  uVar226 = auVar1._0_8_;
  auVar70._8_8_ = 0;
  auVar70._0_8_ = local_d0.z[2];
  auVar170._8_8_ = 0;
  auVar170._0_8_ = uVar218;
  auVar71._8_8_ = 0;
  auVar71._0_8_ = local_d0.z[4];
  auVar171._8_8_ = 0;
  auVar171._0_8_ = uVar217;
  auVar72._8_8_ = 0;
  auVar72._0_8_ = local_d0.z[3];
  auVar172._8_8_ = 0;
  auVar172._0_8_ = uVar219;
  auVar73._8_8_ = 0;
  auVar73._0_8_ = local_d0.z[3];
  auVar173._8_8_ = 0;
  auVar173._0_8_ = uVar218;
  auVar74._8_8_ = 0;
  auVar74._0_8_ = local_d0.z[4];
  auVar174._8_8_ = 0;
  auVar174._0_8_ = uVar219;
  auVar75._8_8_ = 0;
  auVar75._0_8_ = local_d0.z[4];
  auVar175._8_8_ = 0;
  auVar175._0_8_ = uVar218;
  auVar210._8_8_ = 0;
  auVar210._0_8_ = auVar1._8_8_ * 0x2000 | uVar226 >> 0x33;
  auVar210 = auVar71 * auVar171 +
             auVar72 * auVar172 + auVar70 * auVar170 + auVar52 * auVar152 + auVar53 * auVar153 +
             auVar210;
  uVar221 = auVar210._0_8_;
  auVar211._8_8_ = 0;
  auVar211._0_8_ = auVar210._8_8_ * 0x2000 | uVar221 >> 0x33;
  auVar211 = auVar74 * auVar174 +
             auVar73 * auVar173 + auVar54 * auVar154 + auVar55 * auVar155 + auVar56 * auVar156 +
             auVar211;
  uVar218 = auVar211._0_8_;
  auVar204._8_8_ = 0;
  auVar204._0_8_ = auVar211._8_8_ * 0x2000 | uVar218 >> 0x33;
  auVar204 = auVar75 * auVar175 +
             auVar57 * auVar157 + auVar59 * auVar159 + auVar58 * auVar158 + auVar60 * auVar160 +
             auVar204;
  uVar224 = auVar204._0_8_;
  auVar212._8_8_ = 0;
  auVar212._0_8_ = auVar204._8_8_ << 0xd | uVar224 >> 0x33;
  auVar212 = auVar61 * auVar161 +
             auVar64 * auVar164 + auVar65 * auVar165 + auVar62 * auVar162 + auVar63 * auVar163 +
             auVar212;
  uVar220 = auVar212._0_8_;
  auVar76._8_8_ = 0;
  auVar76._0_8_ = local_d0.y[0];
  auVar176._8_8_ = 0;
  auVar176._0_8_ = local_d0.x[0];
  auVar77._8_8_ = 0;
  auVar77._0_8_ = local_d0.y[0];
  auVar177._8_8_ = 0;
  auVar177._0_8_ = local_d0.x[1];
  auVar78._8_8_ = 0;
  auVar78._0_8_ = local_d0.y[1];
  auVar178._8_8_ = 0;
  auVar178._0_8_ = local_d0.x[0];
  auVar79._8_8_ = 0;
  auVar79._0_8_ = local_d0.y[0];
  auVar179._8_8_ = 0;
  auVar179._0_8_ = local_d0.x[2];
  uVar226 = (auVar212._8_8_ * 0x2000 | uVar220 >> 0x33) * 0x13 + (uVar226 & 0x7ffffffffffff);
  auVar80._8_8_ = 0;
  auVar80._0_8_ = local_d0.y[2];
  auVar180._8_8_ = 0;
  auVar180._0_8_ = local_d0.x[0];
  auVar81._8_8_ = 0;
  auVar81._0_8_ = local_d0.y[1];
  auVar181._8_8_ = 0;
  auVar181._0_8_ = local_d0.x[1];
  auVar82._8_8_ = 0;
  auVar82._0_8_ = local_d0.y[0];
  auVar182._8_8_ = 0;
  auVar182._0_8_ = local_d0.x[3];
  auVar83._8_8_ = 0;
  auVar83._0_8_ = local_d0.y[3];
  auVar183._8_8_ = 0;
  auVar183._0_8_ = local_d0.x[0];
  auVar84._8_8_ = 0;
  auVar84._0_8_ = local_d0.y[1];
  auVar184._8_8_ = 0;
  auVar184._0_8_ = local_d0.x[2];
  auVar85._8_8_ = 0;
  auVar85._0_8_ = local_d0.y[2];
  auVar185._8_8_ = 0;
  auVar185._0_8_ = local_d0.x[1];
  auVar86._8_8_ = 0;
  auVar86._0_8_ = local_d0.y[0];
  auVar186._8_8_ = 0;
  auVar186._0_8_ = local_d0.x[4];
  auVar87._8_8_ = 0;
  auVar87._0_8_ = local_d0.y[4];
  auVar187._8_8_ = 0;
  auVar187._0_8_ = local_d0.x[0];
  uVar217 = local_d0.y[3] * 0x13;
  auVar88._8_8_ = 0;
  auVar88._0_8_ = local_d0.y[3];
  auVar188._8_8_ = 0;
  auVar188._0_8_ = local_d0.x[1];
  uVar219 = local_d0.y[4] * 0x13;
  auVar89._8_8_ = 0;
  auVar89._0_8_ = local_d0.y[1];
  auVar189._8_8_ = 0;
  auVar189._0_8_ = local_d0.x[3];
  auVar90._8_8_ = 0;
  auVar90._0_8_ = local_d0.y[2];
  auVar190._8_8_ = 0;
  auVar190._0_8_ = local_d0.x[2];
  auVar91._8_8_ = 0;
  auVar91._0_8_ = uVar219;
  auVar191._8_8_ = 0;
  auVar191._0_8_ = local_d0.x[1];
  auVar92._8_8_ = 0;
  auVar92._0_8_ = local_d0.y[1] * 0x13;
  auVar192._8_8_ = 0;
  auVar192._0_8_ = local_d0.x[4];
  auVar93._8_8_ = 0;
  auVar93._0_8_ = local_d0.y[2] * 0x13;
  auVar193._8_8_ = 0;
  auVar193._0_8_ = local_d0.x[3];
  auVar94._8_8_ = 0;
  auVar94._0_8_ = uVar217;
  auVar194._8_8_ = 0;
  auVar194._0_8_ = local_d0.x[2];
  auVar1 = auVar91 * auVar191 +
           auVar94 * auVar194 + auVar93 * auVar193 + auVar92 * auVar192 + auVar76 * auVar176;
  uVar228 = auVar1._0_8_;
  auVar95._8_8_ = 0;
  auVar95._0_8_ = uVar219;
  auVar195._8_8_ = 0;
  auVar195._0_8_ = local_d0.x[2];
  auVar96._8_8_ = 0;
  auVar96._0_8_ = local_d0.y[2] * 0x13;
  auVar196._8_8_ = 0;
  auVar196._0_8_ = local_d0.x[4];
  auVar97._8_8_ = 0;
  auVar97._0_8_ = uVar217;
  auVar197._8_8_ = 0;
  auVar197._0_8_ = local_d0.x[3];
  auVar98._8_8_ = 0;
  auVar98._0_8_ = uVar219;
  auVar198._8_8_ = 0;
  auVar198._0_8_ = local_d0.x[3];
  auVar99._8_8_ = 0;
  auVar99._0_8_ = uVar217;
  auVar199._8_8_ = 0;
  auVar199._0_8_ = local_d0.x[4];
  r->y[0] = uVar225 & 0x7ffffffffffff;
  auVar100._8_8_ = 0;
  auVar100._0_8_ = uVar219;
  auVar200._8_8_ = 0;
  auVar200._0_8_ = local_d0.x[4];
  auVar213._8_8_ = 0;
  auVar213._0_8_ = auVar1._8_8_ * 0x2000 | uVar228 >> 0x33;
  r->y[1] = (uVar225 >> 0x33) + (uVar227 & 0x7ffffffffffff);
  r->y[2] = uVar222 & 0x7ffffffffffff;
  auVar213 = auVar95 * auVar195 +
             auVar97 * auVar197 + auVar96 * auVar196 + auVar77 * auVar177 + auVar78 * auVar178 +
             auVar213;
  uVar219 = auVar213._0_8_;
  auVar214._8_8_ = 0;
  auVar214._0_8_ = auVar213._8_8_ * 0x2000 | uVar219 >> 0x33;
  r->y[3] = uVar223 & 0x7ffffffffffff;
  r->y[4] = uVar229 & 0x7ffffffffffff;
  auVar214 = auVar98 * auVar198 +
             auVar80 * auVar180 + auVar79 * auVar179 + auVar81 * auVar181 + auVar99 * auVar199 +
             auVar214;
  uVar229 = auVar214._0_8_;
  auVar215._8_8_ = 0;
  auVar215._0_8_ = auVar214._8_8_ * 0x2000 | uVar229 >> 0x33;
  auVar215 = auVar100 * auVar200 +
             auVar83 * auVar183 + auVar85 * auVar185 + auVar82 * auVar182 + auVar84 * auVar184 +
             auVar215;
  uVar222 = auVar215._0_8_;
  auVar216._8_8_ = 0;
  auVar216._0_8_ = auVar215._8_8_ * 0x2000 | uVar222 >> 0x33;
  r->z[0] = uVar226 & 0x7ffffffffffff;
  r->z[1] = (uVar226 >> 0x33) + (uVar221 & 0x7ffffffffffff);
  r->z[2] = uVar218 & 0x7ffffffffffff;
  r->z[3] = uVar224 & 0x7ffffffffffff;
  auVar216 = auVar87 * auVar187 +
             auVar88 * auVar188 + auVar90 * auVar190 + auVar86 * auVar186 + auVar89 * auVar189 +
             auVar216;
  uVar218 = auVar216._0_8_;
  r->z[4] = uVar220 & 0x7ffffffffffff;
  uVar217 = (auVar216._8_8_ * 0x2000 | uVar218 >> 0x33) * 0x13 + (uVar228 & 0x7ffffffffffff);
  r->t[0] = uVar217 & 0x7ffffffffffff;
  r->t[1] = (uVar217 >> 0x33) + (uVar219 & 0x7ffffffffffff);
  r->t[2] = uVar229 & 0x7ffffffffffff;
  r->t[3] = uVar222 & 0x7ffffffffffff;
  r->t[4] = uVar218 & 0x7ffffffffffff;
  return;
}

Assistant:

static void
ge25519_double(ge25519 *r, const ge25519 *p) {
	ge25519_p1p1 t;
	ge25519_double_p1p1(&t, p);
	ge25519_p1p1_to_full(r, &t);
}